

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraintSecondDerivatives
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *lambda,CollocationHessianMap *stateSecondDerivative,
          CollocationHessianMap *controlSecondDerivative,
          CollocationHessianMap *stateControlSecondDerivative)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  size_type sVar5;
  ostream *poVar6;
  char *pcVar7;
  element_type *peVar8;
  const_reference pvVar9;
  mapped_type *pmVar10;
  MatrixDynSize *this_00;
  MatrixDynSize *pMVar11;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RDX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RSI;
  long in_RDI;
  key_type *in_R9;
  undefined8 in_XMM0_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffa48;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffa50;
  VectorDynSize *in_stack_fffffffffffffa68;
  key_type *in_stack_fffffffffffffa88;
  StorageBaseType *in_stack_fffffffffffffa90;
  double *in_stack_fffffffffffffa98;
  CollocationHessianIndex local_498;
  CollocationHessianIndex local_488;
  CollocationHessianIndex local_478;
  CollocationHessianIndex local_468;
  CollocationHessianIndex local_458;
  CollocationHessianIndex local_448;
  CollocationHessianIndex local_438;
  CollocationHessianIndex local_428;
  CollocationHessianIndex local_418;
  CollocationHessianIndex local_408 [8];
  string local_388 [32];
  ostringstream local_368 [376];
  string local_1f0 [48];
  ostringstream local_1c0 [376];
  key_type *local_48;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_28;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_48 = in_R9;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (bVar2) {
    sVar5 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_20);
    if (sVar5 == 2) {
      sVar5 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                        (local_28);
      if (sVar5 == 2) {
        peVar8 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3a8ec3);
        pvVar9 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                 operator[](local_28,0);
        uVar3 = (*peVar8->_vptr_DynamicalSystem[3])(peVar8,pvVar9);
        if ((uVar3 & 1) == 0) {
          IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8f02);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError
                    (pcVar4,"evaluateCollocationConstraintSecondDerivatives",
                     "Error while setting the control input.");
          local_1 = 0;
        }
        else {
          toEigen(in_stack_fffffffffffffa68);
          Eigen::operator*(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          toEigen(in_stack_fffffffffffffa68);
          Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                    (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
          peVar8 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3a8fa1);
          uVar1 = local_18;
          pvVar9 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                   operator[](local_20,0);
          uVar3 = (*peVar8->_vptr_DynamicalSystem[0xd])
                            (uVar1,peVar8,pvVar9,in_RDI + 0x1e0,in_RDI + 0x168);
          if ((uVar3 & 1) == 0) {
            IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a9014);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iDynTree::reportError
                      (pcVar4,"evaluateCollocationConstraintSecondDerivatives",
                       "Error while evaluating the dynamical system state second derivative.");
            local_1 = 0;
          }
          else {
            CollocationHessianIndex::CollocationHessianIndex(local_408,0,0);
            pmVar10 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                    *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
            iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0x168));
            CollocationHessianIndex::CollocationHessianIndex(&local_418,0,1);
            pmVar10 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                    *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
            iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0xf0));
            CollocationHessianIndex::CollocationHessianIndex(&local_428,1,1);
            pmVar10 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                    *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
            iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0xf0));
            peVar8 = std::
                     __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x3a9170);
            uVar1 = local_18;
            pvVar9 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                     ::operator[](local_20,0);
            uVar3 = (*peVar8->_vptr_DynamicalSystem[0xe])
                              (uVar1,peVar8,pvVar9,in_RDI + 0x1e0,in_RDI + 400);
            if ((uVar3 & 1) == 0) {
              IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a91e3);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              iDynTree::reportError
                        (pcVar4,"evaluateCollocationConstraintSecondDerivatives",
                         "Error while evaluating the dynamical system control second derivative.");
              local_1 = 0;
            }
            else {
              this_00 = (MatrixDynSize *)(in_RDI + 400);
              CollocationHessianIndex::CollocationHessianIndex(&local_438,0,0);
              pmVar10 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                      *)this_00,local_48);
              iDynTree::MatrixDynSize::operator=(pmVar10,this_00);
              CollocationHessianIndex::CollocationHessianIndex(&local_448,0,1);
              pmVar10 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                      *)this_00,local_48);
              iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0x118));
              CollocationHessianIndex::CollocationHessianIndex(&local_458,1,1);
              pmVar10 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                      *)this_00,local_48);
              iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0x118));
              peVar8 = std::
                       __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x3a931b);
              pvVar9 = std::
                       vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                       operator[](local_20,0);
              uVar3 = (*peVar8->_vptr_DynamicalSystem[0xf])
                                (local_18,peVar8,pvVar9,in_RDI + 0x1e0,in_RDI + 0x1b8);
              if ((uVar3 & 1) == 0) {
                IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a9382);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                iDynTree::reportError
                          (pcVar4,"evaluateCollocationConstraintSecondDerivatives",
                           "Error while evaluating the dynamical system second derivative wrt state and control."
                          );
                local_1 = 0;
              }
              else {
                pMVar11 = (MatrixDynSize *)(in_RDI + 0x1b8);
                CollocationHessianIndex::CollocationHessianIndex(&local_468,0,0);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                        *)this_00,local_48);
                iDynTree::MatrixDynSize::operator=(pmVar10,pMVar11);
                CollocationHessianIndex::CollocationHessianIndex(&local_478,0,1);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                        *)this_00,local_48);
                iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0x140));
                CollocationHessianIndex::CollocationHessianIndex(&local_488,1,0);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                        *)this_00,local_48);
                iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0x140));
                CollocationHessianIndex::CollocationHessianIndex(&local_498,1,1);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                        *)this_00,local_48);
                iDynTree::MatrixDynSize::operator=(pmVar10,(MatrixDynSize *)(in_RDI + 0x140));
                local_1 = 1;
              }
            }
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_368);
        std::operator<<((ostream *)local_368,
                        "The size of the matrix containing the control inputs does not match the expected one. Input = "
                       );
        sVar5 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                          (local_28);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_368,sVar5);
        std::operator<<(poVar6,", Expected = 2.");
        IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8de6);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError(pcVar4,"evaluateCollocationConstraintSecondDerivatives",pcVar7);
        std::__cxx11::string::~string(local_388);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_368);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      std::operator<<((ostream *)local_1c0,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      sVar5 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                        (local_20);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,sVar5);
      std::operator<<(poVar6,", Expected = 2.");
      IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8c8a);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar4,"evaluateCollocationConstraintSecondDerivatives",pcVar7);
      std::__cxx11::string::~string(local_1f0);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
    }
  }
  else {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8bcf);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar4,"evaluateCollocationConstraintSecondDerivatives","Dynamical system not set.");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraintSecondDerivatives(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                              const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                              const VectorDynSize &lambda, CollocationHessianMap &stateSecondDerivative,
                                                                              CollocationHessianMap &controlSecondDerivative, CollocationHessianMap &stateControlSecondDerivative)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                toEigen(m_lambda) = dT * toEigen(lambda);

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time, collocationPoints[0], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(0, 0)] = m_stateHessianBuffer;

                stateSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNxBuffer;

                stateSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNxNxBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time, collocationPoints[0], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(0, 0)] = m_controlHessianBuffer;

                controlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNuNuBuffer;

                controlSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNuNuBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time, collocationPoints[0], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(0, 0)] = m_mixedHessianBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 0)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNxNuBuffer;


                return true;
            }